

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdNode ** Cudd_bddPickArbitraryMinterms(DdManager *dd,DdNode *f,DdNode **vars,int n,int k)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char **string_00;
  char *pcVar6;
  void *__ptr;
  ulong uVar7;
  DdNode *pDVar8;
  double dVar9;
  int local_80;
  int isSame;
  int savePoint;
  int saveFlag;
  char *saveString;
  double minterms;
  DdNode *neW;
  DdNode **old;
  int result;
  int *indices;
  int size;
  int l;
  int j;
  int i;
  char **string;
  int k_local;
  int n_local;
  DdNode **vars_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  local_80 = -1;
  dVar9 = Cudd_CountMinterm(dd,f,n);
  if ((double)k <= dVar9) {
    iVar5 = dd->size;
    string_00 = (char **)malloc((long)k << 3);
    if (string_00 == (char **)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      dd_local = (DdManager *)0x0;
    }
    else {
      for (l = 0; l < k; l = l + 1) {
        pcVar6 = (char *)malloc((long)(iVar5 + 1));
        string_00[l] = pcVar6;
        if (string_00[l] == (char *)0x0) {
          for (size = 0; size < l; size = size + 1) {
            if (string_00[l] != (char *)0x0) {
              free(string_00[l]);
              string_00[l] = (char *)0x0;
            }
          }
          if (string_00 != (char **)0x0) {
            free(string_00);
          }
          dd->errorCode = CUDD_MEMORY_OUT;
          return (DdNode **)0x0;
        }
        for (size = 0; size < iVar5; size = size + 1) {
          string_00[l][size] = '2';
        }
        string_00[l][iVar5] = '\0';
      }
      __ptr = malloc((long)n << 2);
      if (__ptr == (void *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (l = 0; l < k; l = l + 1) {
          if (string_00[l] != (char *)0x0) {
            free(string_00[l]);
            string_00[l] = (char *)0x0;
          }
        }
        if (string_00 != (char **)0x0) {
          free(string_00);
        }
        dd_local = (DdManager *)0x0;
      }
      else {
        for (l = 0; l < n; l = l + 1) {
          *(DdHalfWord *)((long)__ptr + (long)l * 4) = vars[l]->index;
        }
        iVar4 = ddPickArbitraryMinterms(dd,f,n,k,string_00);
        if (iVar4 == 0) {
          for (l = 0; l < k; l = l + 1) {
            if (string_00[l] != (char *)0x0) {
              free(string_00[l]);
              string_00[l] = (char *)0x0;
            }
          }
          if (string_00 != (char **)0x0) {
            free(string_00);
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          dd_local = (DdManager *)0x0;
        }
        else {
          dd_local = (DdManager *)malloc((long)k << 3);
          if (dd_local == (DdManager *)0x0) {
            dd->errorCode = CUDD_MEMORY_OUT;
            for (l = 0; l < k; l = l + 1) {
              if (string_00[l] != (char *)0x0) {
                free(string_00[l]);
                string_00[l] = (char *)0x0;
              }
            }
            if (string_00 != (char **)0x0) {
              free(string_00);
            }
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            dd_local = (DdManager *)0x0;
          }
          else {
            pcVar6 = (char *)malloc((long)(iVar5 + 1));
            if (pcVar6 == (char *)0x0) {
              dd->errorCode = CUDD_MEMORY_OUT;
              for (l = 0; l < k; l = l + 1) {
                if (string_00[l] != (char *)0x0) {
                  free(string_00[l]);
                  string_00[l] = (char *)0x0;
                }
              }
              if (string_00 != (char **)0x0) {
                free(string_00);
              }
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              if (dd_local != (DdManager *)0x0) {
                free(dd_local);
              }
              dd_local = (DdManager *)0x0;
            }
            else {
              bVar1 = false;
              for (l = 0; l < k; l = l + 1) {
                bVar2 = false;
                size = l;
                if (bVar1) {
                  iVar5 = strcmp(string_00[l],pcVar6);
                  if (iVar5 == 0) {
                    bVar2 = true;
                  }
                  else {
                    bVar1 = false;
                    do {
                      size = size + 1;
                      if (k <= size) goto LAB_00a365b7;
                      iVar5 = strcmp(string_00[l],string_00[size]);
                    } while (iVar5 != 0);
                    local_80 = l;
                    strcpy(pcVar6,string_00[l]);
                    bVar1 = true;
                  }
                }
                else {
                  do {
                    size = size + 1;
                    if (k <= size) goto LAB_00a365b7;
                    iVar5 = strcmp(string_00[l],string_00[size]);
                  } while (iVar5 != 0);
                  local_80 = l;
                  strcpy(pcVar6,string_00[l]);
                  bVar1 = true;
                }
LAB_00a365b7:
                for (size = 0; size < n; size = size + 1) {
                  if (string_00[l][*(int *)((long)__ptr + (long)size * 4)] == '2') {
                    uVar7 = Cudd_Random();
                    cVar3 = '0';
                    if ((uVar7 & 0x20) != 0) {
                      cVar3 = '1';
                    }
                    string_00[l][*(int *)((long)__ptr + (long)size * 4)] = cVar3;
                  }
                }
                while (bVar2) {
                  bVar2 = false;
                  for (size = local_80; size < l; size = size + 1) {
                    iVar5 = strcmp(string_00[l],string_00[size]);
                    if (iVar5 == 0) {
                      bVar2 = true;
                      break;
                    }
                  }
                  if (bVar2) {
                    strcpy(string_00[l],pcVar6);
                    for (size = 0; size < n; size = size + 1) {
                      if (string_00[l][*(int *)((long)__ptr + (long)size * 4)] == '2') {
                        uVar7 = Cudd_Random();
                        cVar3 = '0';
                        if ((uVar7 & 0x20) != 0) {
                          cVar3 = '1';
                        }
                        string_00[l][*(int *)((long)__ptr + (long)size * 4)] = cVar3;
                      }
                    }
                  }
                }
                pDVar8 = Cudd_ReadOne(dd);
                *(DdNode **)(&(dd_local->sentinel).index + (long)l * 2) = pDVar8;
                uVar7 = *(ulong *)(&(dd_local->sentinel).index + (long)l * 2) & 0xfffffffffffffffe;
                *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
                for (size = 0; size < n; size = size + 1) {
                  if (string_00[l][*(int *)((long)__ptr + (long)size * 4)] == '0') {
                    minterms = (double)Cudd_bddAnd(dd,*(DdNode **)
                                                       (&(dd_local->sentinel).index + (long)l * 2),
                                                   (DdNode *)((ulong)vars[size] ^ 1));
                  }
                  else {
                    minterms = (double)Cudd_bddAnd(dd,*(DdNode **)
                                                       (&(dd_local->sentinel).index + (long)l * 2),
                                                   vars[size]);
                  }
                  if (minterms == 0.0) {
                    if (pcVar6 != (char *)0x0) {
                      free(pcVar6);
                    }
                    for (indices._4_4_ = 0; indices._4_4_ < k; indices._4_4_ = indices._4_4_ + 1) {
                      if (string_00[indices._4_4_] != (char *)0x0) {
                        free(string_00[indices._4_4_]);
                        string_00[indices._4_4_] = (char *)0x0;
                      }
                    }
                    if (string_00 != (char **)0x0) {
                      free(string_00);
                    }
                    if (__ptr != (void *)0x0) {
                      free(__ptr);
                    }
                    for (indices._4_4_ = 0; indices._4_4_ <= l; indices._4_4_ = indices._4_4_ + 1) {
                      Cudd_RecursiveDeref(dd,*(DdNode **)
                                              (&(dd_local->sentinel).index + (long)indices._4_4_ * 2
                                              ));
                    }
                    if (dd_local != (DdManager *)0x0) {
                      free(dd_local);
                    }
                    return (DdNode **)0x0;
                  }
                  *(int *)(((ulong)minterms & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)minterms & 0xfffffffffffffffe) + 4) + 1;
                  Cudd_RecursiveDeref(dd,*(DdNode **)(&(dd_local->sentinel).index + (long)l * 2));
                  *(double *)(&(dd_local->sentinel).index + (long)l * 2) = minterms;
                }
                iVar5 = Cudd_bddLeq(dd,*(DdNode **)(&(dd_local->sentinel).index + (long)l * 2),f);
                if (iVar5 == 0) {
                  if (pcVar6 != (char *)0x0) {
                    free(pcVar6);
                  }
                  for (indices._4_4_ = 0; indices._4_4_ < k; indices._4_4_ = indices._4_4_ + 1) {
                    if (string_00[indices._4_4_] != (char *)0x0) {
                      free(string_00[indices._4_4_]);
                      string_00[indices._4_4_] = (char *)0x0;
                    }
                  }
                  if (string_00 != (char **)0x0) {
                    free(string_00);
                  }
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                  for (indices._4_4_ = 0; indices._4_4_ <= l; indices._4_4_ = indices._4_4_ + 1) {
                    Cudd_RecursiveDeref(dd,*(DdNode **)
                                            (&(dd_local->sentinel).index + (long)indices._4_4_ * 2))
                    ;
                  }
                  if (dd_local != (DdManager *)0x0) {
                    free(dd_local);
                  }
                  return (DdNode **)0x0;
                }
              }
              if (pcVar6 != (char *)0x0) {
                free(pcVar6);
              }
              for (l = 0; l < k; l = l + 1) {
                uVar7 = *(ulong *)(&(dd_local->sentinel).index + (long)l * 2) & 0xfffffffffffffffe;
                *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + -1;
                if (string_00[l] != (char *)0x0) {
                  free(string_00[l]);
                  string_00[l] = (char *)0x0;
                }
              }
              if (string_00 != (char **)0x0) {
                free(string_00);
              }
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
          }
        }
      }
    }
  }
  else {
    dd_local = (DdManager *)0x0;
  }
  return (DdNode **)dd_local;
}

Assistant:

DdNode **
Cudd_bddPickArbitraryMinterms(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick k minterms */,
  DdNode ** vars /* array of variables */,
  int  n /* size of <code>vars</code> */,
  int  k /* number of minterms to find */)
{
    char **string;
    int i, j, l, size;
    int *indices;
    int result;
    DdNode **old, *neW;
    double minterms;
    char *saveString;
    int saveFlag, savePoint = -1, isSame;

    minterms = Cudd_CountMinterm(dd,f,n);
    if ((double)k > minterms) {
        return(NULL);
    }

    size = dd->size;
    string = ABC_ALLOC(char *, k);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < k; i++) {
        string[i] = ABC_ALLOC(char, size + 1);
        if (string[i] == NULL) {
            for (j = 0; j < i; j++)
                ABC_FREE(string[i]);
            ABC_FREE(string);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        for (j = 0; j < size; j++) string[i][j] = '2';
        string[i][size] = '\0';
    }
    indices = ABC_ALLOC(int,n);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        return(NULL);
    }

    for (i = 0; i < n; i++) {
        indices[i] = vars[i]->index;
    }

    result = ddPickArbitraryMinterms(dd,f,n,k,string);
    if (result == 0) {
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }

    old = ABC_ALLOC(DdNode *, k);
    if (old == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }
    saveString = ABC_ALLOC(char, size + 1);
    if (saveString == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        ABC_FREE(old);
        return(NULL);
    }
    saveFlag = 0;

    /* Build result BDD array. */
    for (i = 0; i < k; i++) {
        isSame = 0;
        if (!saveFlag) {
            for (j = i + 1; j < k; j++) {
                if (strcmp(string[i], string[j]) == 0) {
                    savePoint = i;
                    strcpy(saveString, string[i]);
                    saveFlag = 1;
                    break;
                }
            }
        } else {
            if (strcmp(string[i], saveString) == 0) {
                isSame = 1;
            } else {
                saveFlag = 0;
                for (j = i + 1; j < k; j++) {
                    if (strcmp(string[i], string[j]) == 0) {
                        savePoint = i;
                        strcpy(saveString, string[i]);
                        saveFlag = 1;
                        break;
                    }
                }
            }
        }
        /* Randomize choice for don't cares. */
        for (j = 0; j < n; j++) {
            if (string[i][indices[j]] == '2')
                string[i][indices[j]] =
                  (char) ((Cudd_Random() & 0x20) ? '1' : '0');
        }

        while (isSame) {
            isSame = 0;
            for (j = savePoint; j < i; j++) {
                if (strcmp(string[i], string[j]) == 0) {
                    isSame = 1;
                    break;
                }
            }
            if (isSame) {
                strcpy(string[i], saveString);
                /* Randomize choice for don't cares. */
                for (j = 0; j < n; j++) {
                    if (string[i][indices[j]] == '2')
                        string[i][indices[j]] =
                          (char) ((Cudd_Random() & 0x20) ? '1' : '0');
                }
            }
        }

        old[i] = Cudd_ReadOne(dd);
        cuddRef(old[i]);

        for (j = 0; j < n; j++) {
            if (string[i][indices[j]] == '0') {
                neW = Cudd_bddAnd(dd,old[i],Cudd_Not(vars[j]));
            } else {
                neW = Cudd_bddAnd(dd,old[i],vars[j]);
            }
            if (neW == NULL) {
                ABC_FREE(saveString);
                for (l = 0; l < k; l++)
                    ABC_FREE(string[l]);
                ABC_FREE(string);
                ABC_FREE(indices);
                for (l = 0; l <= i; l++)
                    Cudd_RecursiveDeref(dd,old[l]);
                ABC_FREE(old);
                return(NULL);
            }
            cuddRef(neW);
            Cudd_RecursiveDeref(dd,old[i]);
            old[i] = neW;
        }

        /* Test. */
        if (!Cudd_bddLeq(dd,old[i],f)) {
            ABC_FREE(saveString);
            for (l = 0; l < k; l++)
                ABC_FREE(string[l]);
            ABC_FREE(string);
            ABC_FREE(indices);
            for (l = 0; l <= i; l++)
                Cudd_RecursiveDeref(dd,old[l]);
            ABC_FREE(old);
            return(NULL);
        }
    }

    ABC_FREE(saveString);
    for (i = 0; i < k; i++) {
        cuddDeref(old[i]);
        ABC_FREE(string[i]);
    }
    ABC_FREE(string);
    ABC_FREE(indices);
    return(old);

}